

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

QRgba64 * qt_fetch_conical_gradient_rgb64
                    (QRgba64 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  bool bVar1;
  Type TVar2;
  QRgba64 *pQVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar5 = (double)y + 0.5;
  dVar9 = (double)x + 0.5;
  dVar6 = data->m13;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    bVar1 = false;
  }
  else {
    bVar1 = data->m23 == 0.0;
  }
  dVar7 = dVar9 * data->m11 + dVar5 * data->m21 + data->dx;
  dVar8 = dVar9 * data->m12 + dVar5 * data->m22 + data->dy;
  if (bVar1) {
    if (0 < length) {
      dVar7 = dVar7 - *(double *)((long)&data->field_23 + 8);
      dVar8 = dVar8 - *(double *)((long)&data->field_23 + 0x10);
      pQVar3 = buffer;
      do {
        dVar6 = atan2(dVar8,dVar7);
        TVar2 = GradientBase64::fetchSingle
                          (&(data->field_23).gradient,
                           (dVar6 + *(double *)((long)&data->field_23 + 0x18)) *
                           -0.15915494309189535 + 1.0);
        pQVar3->rgba = TVar2.rgba;
        dVar7 = dVar7 + data->m11;
        dVar8 = dVar8 + data->m12;
        pQVar3 = pQVar3 + 1;
      } while (pQVar3 < buffer + length);
    }
  }
  else if (0 < length) {
    dVar6 = dVar6 * dVar9 + dVar5 * data->m23 + data->m33;
    uVar4 = -(ulong)(dVar6 != 0.0);
    dVar6 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)dVar6 & uVar4);
    pQVar3 = buffer;
    do {
      dVar5 = atan2(dVar8 / dVar6 - *(double *)((long)&data->field_23 + 8),
                    dVar7 / dVar6 - *(double *)((long)&data->field_23 + 0x10));
      TVar2 = GradientBase64::fetchSingle
                        (&(data->field_23).gradient,
                         (dVar5 + *(double *)((long)&data->field_23 + 0x18)) * -0.15915494309189535
                         + 1.0);
      pQVar3->rgba = TVar2.rgba;
      dVar7 = dVar7 + data->m11;
      dVar8 = dVar8 + data->m12;
      dVar6 = dVar6 + data->m13;
      dVar6 = (double)((ulong)dVar6 & -(ulong)(dVar6 != 0.0) |
                      ~-(ulong)(dVar6 != 0.0) & (ulong)(data->m13 + dVar6));
      pQVar3 = pQVar3 + 1;
    } while (pQVar3 < buffer + length);
  }
  return buffer;
}

Assistant:

static const QRgba64 * QT_FASTCALL qt_fetch_conical_gradient_rgb64(QRgba64 *buffer, const Operator *, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_conical_gradient_template<GradientBase64, QRgba64>(buffer, data, y, x, length);
}